

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_21::ValidateSingleFeatureLifetimes
          (anon_unknown_21 *this,Edition edition,string_view full_name,FeatureSupport *support,
          ValidationResults *results)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  anon_union_32_1_493b367e_for_FieldOptions_FeatureSupport_3 *paVar1;
  FeatureSupport *pFVar2;
  int iVar3;
  bool bVar4;
  Edition EVar5;
  ValidationResults *pVVar6;
  AlphaNum *e;
  undefined4 in_register_00000034;
  AlphaNum local_438;
  string local_408;
  Edition local_3dc;
  AlphaNum local_3d8;
  AlphaNum local_3a8;
  size_t local_378;
  size_t sStack_370;
  AlphaNum local_368;
  AlphaNum local_338;
  string local_308;
  AlphaNum local_2e8;
  string local_2b8;
  Edition local_28c;
  AlphaNum local_288;
  AlphaNum local_258;
  size_t local_228;
  size_t sStack_220;
  AlphaNum local_218;
  AlphaNum local_1e8;
  string local_1b8;
  AlphaNum local_198;
  string local_158;
  Edition local_12c;
  AlphaNum local_128;
  AlphaNum local_f8;
  size_t local_c8;
  size_t sStack_c0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  FeatureSupport *local_30;
  ValidationResults *results_local;
  FeatureSupport *support_local;
  size_t sStack_18;
  Edition edition_local;
  string_view full_name_local;
  
  sStack_18 = CONCAT44(in_register_00000034,edition);
  full_name_local._M_len = full_name._M_len;
  support_local._4_4_ = (int)this;
  local_30 = support;
  results_local = (ValidationResults *)full_name._M_str;
  pVVar6 = (ValidationResults *)FieldOptions_FeatureSupport::default_instance();
  iVar3 = support_local._4_4_;
  if ((ValidationResults *)full_name._M_str != pVVar6) {
    EVar5 = FieldOptions_FeatureSupport::edition_introduced
                      ((FieldOptions_FeatureSupport *)results_local);
    pFVar2 = local_30;
    if (iVar3 < (int)EVar5) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_80,"Feature ");
      local_c8 = sStack_18;
      sStack_c0 = full_name_local._M_len;
      pc_01._M_str = (char *)full_name_local._M_len;
      pc_01._M_len = sStack_18;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,pc_01);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f8," wasn\'t introduced until edition ");
      local_12c = FieldOptions_FeatureSupport::edition_introduced
                            ((FieldOptions_FeatureSupport *)results_local);
      local_158.field_2._M_allocated_capacity = 0;
      local_158.field_2._8_8_ = 0;
      local_158._M_dataplus = (_Alloc_hider)0x0;
      local_158._1_7_ = 0;
      local_158._M_string_length = 0;
      absl::lts_20250127::strings_internal::StringifySink::StringifySink
                ((StringifySink *)&local_158);
      absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                (&local_128,&local_12c,(StringifySink *)&local_158);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_198," and can\'t be used in edition ");
      absl::lts_20250127::StrCat<google::protobuf::Edition>
                (&local_50,&local_80,&local_b0,&local_f8,&local_128,&local_198,
                 (Edition *)((long)&support_local + 4));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pFVar2,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                ((StringifySink *)&local_158);
    }
    bVar4 = FieldOptions_FeatureSupport::has_edition_removed
                      ((FieldOptions_FeatureSupport *)results_local);
    iVar3 = support_local._4_4_;
    if ((bVar4) &&
       (EVar5 = FieldOptions_FeatureSupport::edition_removed
                          ((FieldOptions_FeatureSupport *)results_local), pFVar2 = local_30,
       (int)EVar5 <= iVar3)) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1e8,"Feature ");
      local_228 = sStack_18;
      sStack_220 = full_name_local._M_len;
      pc_00._M_str = (char *)full_name_local._M_len;
      pc_00._M_len = sStack_18;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_218,pc_00);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_258," has been removed in edition ");
      local_28c = FieldOptions_FeatureSupport::edition_removed
                            ((FieldOptions_FeatureSupport *)results_local);
      local_2b8.field_2._M_allocated_capacity = 0;
      local_2b8.field_2._8_8_ = 0;
      local_2b8._M_dataplus = (_Alloc_hider)0x0;
      local_2b8._1_7_ = 0;
      local_2b8._M_string_length = 0;
      absl::lts_20250127::strings_internal::StringifySink::StringifySink
                ((StringifySink *)&local_2b8);
      absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                (&local_288,&local_28c,(StringifySink *)&local_2b8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2e8," and can\'t be used in edition ");
      absl::lts_20250127::StrCat<google::protobuf::Edition>
                (&local_1b8,&local_1e8,&local_218,&local_258,&local_288,&local_2e8,
                 (Edition *)((long)&support_local + 4));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pFVar2,
                 &local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                ((StringifySink *)&local_2b8);
    }
    else {
      bVar4 = FieldOptions_FeatureSupport::has_edition_deprecated
                        ((FieldOptions_FeatureSupport *)results_local);
      iVar3 = support_local._4_4_;
      if ((bVar4) &&
         (EVar5 = FieldOptions_FeatureSupport::edition_deprecated
                            ((FieldOptions_FeatureSupport *)results_local), (int)EVar5 <= iVar3)) {
        paVar1 = &local_30->field_0;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_338,"Feature ");
        local_378 = sStack_18;
        sStack_370 = full_name_local._M_len;
        pc._M_str = (char *)full_name_local._M_len;
        pc._M_len = sStack_18;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_368,pc);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_3a8," has been deprecated in edition ");
        local_3dc = FieldOptions_FeatureSupport::edition_deprecated
                              ((FieldOptions_FeatureSupport *)results_local);
        local_408.field_2._M_allocated_capacity = 0;
        local_408.field_2._8_8_ = 0;
        local_408._M_dataplus = (_Alloc_hider)0x0;
        local_408._1_7_ = 0;
        local_408._M_string_length = 0;
        absl::lts_20250127::strings_internal::StringifySink::StringifySink
                  ((StringifySink *)&local_408);
        absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                  (&local_3d8,&local_3dc,(StringifySink *)&local_408);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_438,": ");
        e = (AlphaNum *)
            FieldOptions_FeatureSupport::deprecation_warning_abi_cxx11_
                      ((FieldOptions_FeatureSupport *)results_local);
        absl::lts_20250127::StrCat<std::__cxx11::string>
                  (&local_308,(lts_20250127 *)&local_338,&local_368,&local_3a8,&local_3d8,&local_438
                   ,e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(paVar1->_impl_).deprecation_warning_,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                  ((StringifySink *)&local_408);
      }
    }
  }
  return;
}

Assistant:

void ValidateSingleFeatureLifetimes(
    Edition edition, absl::string_view full_name,
    const FieldOptions::FeatureSupport& support,
    FeatureResolver::ValidationResults& results) {
  // Skip fields that don't have feature support specified.
  if (&support == &FieldOptions::FeatureSupport::default_instance()) return;

  if (edition < support.edition_introduced()) {
    results.errors.emplace_back(
        absl::StrCat("Feature ", full_name, " wasn't introduced until edition ",
                     support.edition_introduced(),
                     " and can't be used in edition ", edition));
  }
  if (support.has_edition_removed() && edition >= support.edition_removed()) {
    results.errors.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been removed in edition ",
        support.edition_removed(), " and can't be used in edition ", edition));
  } else if (support.has_edition_deprecated() &&
             edition >= support.edition_deprecated()) {
    results.warnings.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been deprecated in edition ",
        support.edition_deprecated(), ": ", support.deprecation_warning()));
  }
}